

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,bool bIsDeviceInternal)

{
  GLTextureCreateReleaseHelper local_38;
  undefined1 local_31;
  TextureDesc *pTStack_30;
  bool bIsDeviceInternal_local;
  TextureDesc *TexDesc_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureBaseGL *this_local;
  
  local_31 = bIsDeviceInternal;
  pTStack_30 = TexDesc;
  TexDesc_local = (TextureDesc *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)TexViewObjAllocator;
  TexViewObjAllocator_local = (FixedBlockMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,TexDesc,bIsDeviceInternal);
  AsyncWritableResource::AsyncWritableResource(&this->super_AsyncWritableResource);
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_013a5f78;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_38,0);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,false,local_38);
  RefCntAutoPtr<Diligent::IBuffer>::RefCntAutoPtr(&this->m_pPBO);
  this->m_BindTarget = 0;
  this->m_GLTexFormat = 0;
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             const TextureDesc&         TexDesc,
                             bool                       bIsDeviceInternal) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    },
    m_GlTexture  {false},
    m_BindTarget {0    },
    m_GLTexFormat{0    }
// clang-format on
{
}